

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O1

void __thiscall
bloaty::RangeSink::AddRange
          (RangeSink *this,char *analyzer,string_view name,uint64_t vmaddr,uint64_t vmsize,
          uint64_t fileoff,uint64_t filesize)

{
  pointer ppVar1;
  bool bVar2;
  char *pcVar3;
  Nonnull<char_*> pcVar4;
  char *__s;
  pointer ppVar5;
  uint64_t uVar6;
  string_view format;
  pointer local_190;
  undefined1 *local_168;
  undefined8 local_160;
  undefined1 local_158;
  undefined7 uStack_157;
  string label;
  char local_e0 [32];
  long local_c0;
  Nonnull<char_*> pcStack_b8;
  char local_b0 [32];
  long local_90;
  Nonnull<char_*> pcStack_88;
  char local_80 [32];
  size_type local_60;
  Nonnull<char_*> pcStack_58;
  char local_50 [32];
  
  __s = name._M_str;
  if ((vmsize != 0xffffffffffffffff) && (filesize != 0xffffffffffffffff)) {
    uVar6 = vmsize;
    bVar2 = IsVerboseForVMRange(this,vmaddr,vmsize);
    if ((bVar2) || (bVar2 = IsVerboseForFileRange(this,fileoff,filesize), bVar2)) {
      pcVar3 = GetDataSourceLabel(this->data_source_);
      uVar6 = vmaddr;
      printf("[%s, %s] AddRange(%.*s, %lx, %lx, %lx, %lx)\n",pcVar3,analyzer,name._M_len,__s,vmaddr,
             vmsize,fileoff,filesize);
    }
    if ((this->translator_ == (DualMap *)0x0) ||
       ((bVar2 = RangeMap::CoversRange(&this->translator_->vm_map,vmaddr,vmsize), bVar2 &&
        (bVar2 = RangeMap::CoversRange(&this->translator_->file_map,fileoff,filesize), bVar2)))) {
      ppVar5 = (this->outputs_).
               super__Vector_base<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppVar1 = (this->outputs_).
               super__Vector_base<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (ppVar5 != ppVar1) {
        uVar6 = vmsize;
        if (filesize < vmsize) {
          uVar6 = filesize;
        }
        do {
          NameMunger::Munge_abi_cxx11_(&label,ppVar5->second,name);
          RangeMap::AddDualRange(&ppVar5->first->vm_map,vmaddr,uVar6,fileoff,&label);
          RangeMap::AddDualRange(&ppVar5->first->file_map,fileoff,uVar6,vmaddr,&label);
          RangeMap::AddRange(&ppVar5->first->vm_map,uVar6 + vmaddr,vmsize - uVar6,&label);
          RangeMap::AddRange(&ppVar5->first->file_map,uVar6 + fileoff,filesize - uVar6,&label);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)label._M_dataplus._M_p != &label.field_2) {
            operator_delete(label._M_dataplus._M_p,label.field_2._M_allocated_capacity + 1);
          }
          ppVar5 = ppVar5 + 1;
        } while (ppVar5 != ppVar1);
      }
    }
    else if (0 < verbose_level) {
      if (__s == (char *)0x0) {
        local_190 = (pointer)0x0;
        __s = (char *)0x0;
      }
      else {
        local_190 = (pointer)strlen(__s);
      }
      pcVar4 = absl::numbers_internal::FastIntToBuffer(vmaddr,local_50);
      local_60 = (long)pcVar4 - (long)local_50;
      pcStack_58 = local_50;
      pcVar4 = absl::numbers_internal::FastIntToBuffer(vmsize,local_80);
      local_90 = (long)pcVar4 - (long)local_80;
      pcStack_88 = local_80;
      pcVar4 = absl::numbers_internal::FastIntToBuffer(fileoff,local_b0);
      local_c0 = (long)pcVar4 - (long)local_b0;
      pcStack_b8 = local_b0;
      absl::numbers_internal::FastIntToBuffer(filesize,local_e0);
      local_160 = 0;
      local_158 = 0;
      label._M_dataplus._M_p = local_190;
      label.field_2._M_allocated_capacity = local_60;
      label.field_2._8_8_ = pcStack_58;
      format._M_str = (char *)&label;
      format._M_len =
           (size_t)
           "AddRange($0, $1, $2, $3, $4) will be ignored, because it is not covered by base map.";
      local_168 = &local_158;
      label._M_string_length = (size_type)__s;
      absl::substitute_internal::SubstituteAndAppendArray
                ((substitute_internal *)&local_168,(Nonnull<std::string_*>)0x54,format,
                 (Nullable<const_absl::string_view_*>)0x5,uVar6);
      printf("WARNING: %s\n",local_168);
      if (local_168 != &local_158) {
        operator_delete(local_168,CONCAT71(uStack_157,local_158) + 1);
      }
    }
    return;
  }
  Throw("AddRange() does not allow unknown size.",0x52c);
}

Assistant:

void RangeSink::AddRange(const char* analyzer, string_view name,
                         uint64_t vmaddr, uint64_t vmsize, uint64_t fileoff,
                         uint64_t filesize) {
  if (vmsize == RangeMap::kUnknownSize || filesize == RangeMap::kUnknownSize) {
    // AddRange() is used for segments and sections; the mappings that establish
    // the file <-> vm mapping.  The size should always be known.  Moreover it
    // would be unclear how the logic should work if the size was *not* known.
    THROW("AddRange() does not allow unknown size.");
  }

  if (IsVerboseForVMRange(vmaddr, vmsize) ||
      IsVerboseForFileRange(fileoff, filesize)) {
    printf("[%s, %s] AddRange(%.*s, %" PRIx64 ", %" PRIx64 ", %" PRIx64
           ", %" PRIx64 ")\n",
           GetDataSourceLabel(data_source_), analyzer, (int)name.size(),
           name.data(), vmaddr, vmsize, fileoff, filesize);
  }

  if (translator_) {
    if (!translator_->vm_map.CoversRange(vmaddr, vmsize) ||
        !translator_->file_map.CoversRange(fileoff, filesize)) {
      WARN("AddRange($0, $1, $2, $3, $4) will be ignored, because it is not "
           "covered by base map.",
           name.data(), vmaddr, vmsize, fileoff, filesize);
      return;
    }
  }

  for (auto& pair : outputs_) {
    const std::string label = pair.second->Munge(name);
    uint64_t common = std::min(vmsize, filesize);

    pair.first->vm_map.AddDualRange(vmaddr, common, fileoff, label);
    pair.first->file_map.AddDualRange(fileoff, common, vmaddr, label);

    pair.first->vm_map.AddRange(vmaddr + common, vmsize - common, label);
    pair.first->file_map.AddRange(fileoff + common, filesize - common, label);
  }
}